

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

bool peparse::readRichHeader(bounded_buffer *rich_buf,uint32_t key,rich_header *rich_hdr)

{
  bool bVar1;
  undefined4 *in_RDX;
  uint in_ESI;
  long in_RDI;
  _func_ios_base_ptr_ios_base_ptr *unaff_retaddr;
  uint in_stack_0000000c;
  rich_entry entry;
  uint32_t i;
  uint32_t decrypted_dword;
  uint32_t encrypted_dword;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  value_type *in_stack_fffffffffffffe68;
  string *__lhs;
  vector<peparse::rich_entry,_std::allocator<peparse::rich_entry>_> *in_stack_fffffffffffffe70;
  string local_180 [32];
  string local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120 [24];
  uint32_t *in_stack_fffffffffffffef8;
  string local_100 [4];
  uint32_t in_stack_ffffffffffffff04;
  bounded_buffer *in_stack_ffffffffffffff08;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  undefined2 local_80;
  undefined2 local_7e;
  uint local_7c;
  uint local_78;
  string local_68 [32];
  string local_48 [32];
  uint local_28;
  uint local_24;
  undefined4 *local_20;
  uint local_14;
  long local_10;
  bool local_1;
  
  if (in_RDI == 0) {
    local_1 = false;
  }
  else {
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    bVar1 = readDword(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8)
    ;
    if (bVar1) {
      if ((local_24 ^ local_14) == 0x536e6144) {
        *(undefined1 *)(local_20 + 0xb) = 1;
        *local_20 = 0x536e6144;
        local_28 = 0x536e6144;
        for (local_78 = 0x10; local_78 < *(int *)(local_10 + 8) - 8U; local_78 = local_78 + 8) {
          bVar1 = readDword(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                            in_stack_fffffffffffffef8);
          if (!bVar1) {
            err = 6;
            std::__cxx11::string::assign(err_loc_abi_cxx11_);
            to_string<unsigned_int>(in_stack_0000000c,unaff_retaddr);
            std::operator+((char *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
            std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_a0);
            std::__cxx11::string::~string(local_a0);
            std::__cxx11::string::~string(local_c0);
            return false;
          }
          local_28 = local_24 ^ local_14;
          local_80 = (undefined2)(local_28 >> 0x10);
          local_7e = (undefined2)local_28;
          bVar1 = readDword(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                            in_stack_fffffffffffffef8);
          if (!bVar1) {
            err = 6;
            std::__cxx11::string::assign(err_loc_abi_cxx11_);
            __lhs = local_100;
            to_string<unsigned_int>(in_stack_0000000c,unaff_retaddr);
            std::operator+((char *)__lhs,in_stack_fffffffffffffe60);
            std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_e0);
            std::__cxx11::string::~string(local_e0);
            std::__cxx11::string::~string(local_100);
            return false;
          }
          local_7c = local_24 ^ local_14;
          local_28 = local_7c;
          std::vector<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>::push_back
                    (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        }
        bVar1 = readDword(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                          in_stack_fffffffffffffef8);
        if (bVar1) {
          if (local_20[8] == 0x68636952) {
            local_20[9] = local_14;
            local_1 = true;
          }
          else {
            err = 9;
            std::__cxx11::string::assign(err_loc_abi_cxx11_);
            to_string<unsigned_int>(in_stack_0000000c,unaff_retaddr);
            std::operator+((char *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
            std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_160);
            std::__cxx11::string::~string(local_160);
            std::__cxx11::string::~string(local_180);
            local_1 = false;
          }
        }
        else {
          err = 6;
          std::__cxx11::string::assign(err_loc_abi_cxx11_);
          __rhs = &local_140;
          to_string<unsigned_int>(in_stack_0000000c,unaff_retaddr);
          std::operator+((char *)in_stack_fffffffffffffe68,__rhs);
          std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_120);
          std::__cxx11::string::~string(local_120);
          std::__cxx11::string::~string((string *)&local_140);
          local_1 = false;
        }
      }
      else {
        *(undefined1 *)(local_20 + 0xb) = 0;
        local_1 = false;
      }
    }
    else {
      err = 6;
      std::__cxx11::string::assign(err_loc_abi_cxx11_);
      to_string<unsigned_int>(in_stack_0000000c,unaff_retaddr);
      std::operator+((char *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_48);
      std::__cxx11::string::~string(local_48);
      std::__cxx11::string::~string(local_68);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool readRichHeader(bounded_buffer *rich_buf,
                    std::uint32_t key,
                    rich_header &rich_hdr) {
  if (rich_buf == nullptr) {
    return false;
  }

  std::uint32_t encrypted_dword;
  std::uint32_t decrypted_dword;

  // Confirm DanS signature exists first.
  // The first decrypted DWORD value of the rich header
  // at offset 0 should be 0x536e6144 aka the "DanS" signature
  if (!readDword(rich_buf, 0, encrypted_dword)) {
    PE_ERR(PEERR_READ);
    return false;
  }

  decrypted_dword = encrypted_dword ^ key;

  if (decrypted_dword == RICH_MAGIC_START) {
    // DanS magic found
    rich_hdr.isPresent = true;
    rich_hdr.StartSignature = decrypted_dword;
  } else {
    // DanS magic not found
    rich_hdr.isPresent = false;
    return false;
  }

  // Iterate over the remaining entries.
  // Start from buffer offset 16 because after "DanS" there
  // are three DWORDs of zero padding that can be skipped over.
  // a DWORD is 4 bytes. Loop is incrementing 8 bytes, however
  // we are reading two DWORDS at a time, which is the size
  // of one rich header entry.
  for (std::uint32_t i = 16; i < rich_buf->bufLen - 8; i += 8) {
    rich_entry entry;
    // Read first DWORD of entry and decrypt it
    if (!readDword(rich_buf, i, encrypted_dword)) {
      PE_ERR(PEERR_READ);
      return false;
    }
    decrypted_dword = encrypted_dword ^ key;
    // The high WORD of the first DWORD is the Product ID
    entry.ProductId = (decrypted_dword & 0xFFFF0000) >> 16;
    // The low WORD of the first DWORD is the Build Number
    entry.BuildNumber = (decrypted_dword & 0xFFFF);

    // The second DWORD represents the use count
    if (!readDword(rich_buf, i + 4, encrypted_dword)) {
      PE_ERR(PEERR_READ);
      return false;
    }
    decrypted_dword = encrypted_dword ^ key;
    // The full 32-bit DWORD is the count
    entry.Count = decrypted_dword;

    // Preserve the individual entry
    rich_hdr.Entries.push_back(entry);
  }

  // Preserve the end signature aka "Rich" magic
  if (!readDword(rich_buf, rich_buf->bufLen - 4, rich_hdr.EndSignature)) {
    PE_ERR(PEERR_READ);
    return false;
  };
  if (rich_hdr.EndSignature != RICH_MAGIC_END) {
    PE_ERR(PEERR_MAGIC);
    return false;
  }

  // Preserve the decryption key
  rich_hdr.DecryptionKey = key;

  return true;
}